

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

LinkedTargetDirs * __thiscall
cmCommonTargetGenerator::GetLinkedTargetDirectories
          (LinkedTargetDirs *__return_storage_ptr__,cmCommonTargetGenerator *this,string *lang,
          string *config)

{
  cmGlobalCommonGenerator *pcVar1;
  cmLocalCommonGenerator *this_00;
  bool bVar2;
  cmComputeLinkInformation *this_01;
  ItemVector *this_02;
  cmGeneratorTarget *linkee;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this_03;
  reference ppcVar3;
  reference ppcVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  bool local_221;
  cmGeneratorTarget *target_1;
  iterator __end3;
  iterator __begin3;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range3;
  cmGeneratorTarget *target;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range2_1;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_118;
  reference local_108;
  Item *item;
  const_iterator __end2;
  const_iterator __begin2;
  ItemVector *__range2;
  anon_class_56_7_aa25191b addLinkedTarget;
  cmComputeLinkInformation *cli;
  cmGlobalCommonGenerator *gg;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  direct_emitted;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  forward_emitted;
  string *config_local;
  string *lang_local;
  cmCommonTargetGenerator *this_local;
  LinkedTargetDirs *dirs;
  
  LinkedTargetDirs::LinkedTargetDirs(__return_storage_ptr__);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&direct_emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&gg);
  pcVar1 = this->GlobalCommonGenerator;
  this_01 = cmGeneratorTarget::GetLinkInformation(this->GeneratorTarget,config);
  if (this_01 != (cmComputeLinkInformation *)0x0) {
    addLinkedTarget.dirs = (LinkedTargetDirs *)&gg;
    addLinkedTarget.direct_emitted =
         (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&direct_emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __range2 = (ItemVector *)this;
    addLinkedTarget.this = (cmCommonTargetGenerator *)lang;
    addLinkedTarget.lang = config;
    addLinkedTarget.config = (string *)__return_storage_ptr__;
    addLinkedTarget.forward_emitted =
         (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)pcVar1;
    this_02 = cmComputeLinkInformation::GetItems(this_01);
    __end2 = std::
             vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             ::begin(this_02);
    item = (Item *)std::
                   vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   ::end(this_02);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                  *)&item);
      if (!bVar2) break;
      local_108 = __gnu_cxx::
                  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                  ::operator*(&__end2);
      if (local_108->Target == (cmGeneratorTarget *)0x0) {
        local_221 = false;
        if (local_108->ObjectSource != (cmSourceFile *)0x0) {
          _Var5 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)lang);
          local_118 = _Var5;
          bVar6 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("Fortran",7)
          ;
          local_138 = bVar6;
          local_128 = bVar6;
          local_221 = std::operator==(local_118,bVar6);
        }
        if (local_221 != false) {
          this_00 = this->LocalCommonGenerator;
          cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)&__range2_1,local_108->ObjectSource);
          linkee = cmLocalGenerator::FindGeneratorTargetToUse
                             (&this_00->super_cmLocalGenerator,(string *)&__range2_1);
          GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                    ((anon_class_56_7_aa25191b *)&__range2,linkee,Yes);
          std::__cxx11::string::~string((string *)&__range2_1);
        }
      }
      else {
        GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                  ((anon_class_56_7_aa25191b *)&__range2,local_108->Target,No);
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&__end2);
    }
    this_03 = cmComputeLinkInformation::GetExternalObjectTargets(this_01);
    __end2_1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
               begin(this_03);
    target = (cmGeneratorTarget *)
             std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                       (this_03);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                          *)&target);
      if (!bVar2) break;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end2_1);
      GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                ((anon_class_56_7_aa25191b *)&__range2,*ppcVar3,No);
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end2_1);
    }
    _Var5 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)lang);
    bVar6 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("Fortran",7);
    bVar2 = std::operator==(_Var5,bVar6);
    if (bVar2) {
      cmGeneratorTarget::GetSourceObjectLibraries
                ((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)&__begin3,this->GeneratorTarget,config);
      __end3 = std::
               set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
               ::begin((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                        *)&__begin3);
      target_1 = (cmGeneratorTarget *)
                 std::
                 set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::end((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                        *)&__begin3);
      while( true ) {
        bVar2 = std::operator!=(&__end3,(_Self *)&target_1);
        if (!bVar2) break;
        ppcVar4 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end3);
        GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                  ((anon_class_56_7_aa25191b *)&__range2,*ppcVar4,Yes);
        std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end3);
      }
      std::
      set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              *)&__begin3);
    }
  }
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&gg);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&direct_emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

cmCommonTargetGenerator::LinkedTargetDirs
cmCommonTargetGenerator::GetLinkedTargetDirectories(
  const std::string& lang, const std::string& config) const
{
  LinkedTargetDirs dirs;
  std::set<cmGeneratorTarget const*> forward_emitted;
  std::set<cmGeneratorTarget const*> direct_emitted;
  cmGlobalCommonGenerator* const gg = this->GlobalCommonGenerator;

  enum class Forwarding
  {
    Yes,
    No
  };

  if (cmComputeLinkInformation* cli =
        this->GeneratorTarget->GetLinkInformation(config)) {
    auto addLinkedTarget =
      [this, &lang, &config, &dirs, &direct_emitted, &forward_emitted,
       gg](cmGeneratorTarget const* linkee, Forwarding forward) {
        if (linkee &&
            !linkee->IsImported()
            // Skip targets that build after this one in a static lib cycle.
            && gg->TargetOrderIndexLess(linkee, this->GeneratorTarget)
            // We can ignore the INTERFACE_LIBRARY items because
            // Target->GetLinkInformation already processed their
            // link interface and they don't have any output themselves.
            && (linkee->GetType() != cmStateEnums::INTERFACE_LIBRARY
                // Synthesized targets may have relevant rules.
                || linkee->IsSynthetic()) &&
            ((lang == "CXX"_s && linkee->HaveCxx20ModuleSources()) ||
             (lang == "Fortran"_s && linkee->HaveFortranSources(config)))) {
          cmLocalGenerator* lg = linkee->GetLocalGenerator();
          std::string di = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                    lg->GetTargetDirectory(linkee));
          if (lg->GetGlobalGenerator()->IsMultiConfig()) {
            di = cmStrCat(di, '/', config);
          }
          if (forward == Forwarding::Yes &&
              forward_emitted.insert(linkee).second) {
            dirs.Forward.push_back(di);
          }
          if (direct_emitted.insert(linkee).second) {
            dirs.Direct.emplace_back(di);
          }
        }
      };
    for (auto const& item : cli->GetItems()) {
      if (item.Target) {
        addLinkedTarget(item.Target, Forwarding::No);
      } else if (item.ObjectSource && lang == "Fortran"_s
                 /* Object source files do not have a language associated with
                    them. */
                 /* && item.ObjectSource->GetLanguage() == "Fortran"_s*/) {
        // Fortran modules provided by `$<TARGET_OBJECTS>` as linked items
        // should be collated for use in this target.
        addLinkedTarget(this->LocalCommonGenerator->FindGeneratorTargetToUse(
                          item.ObjectSource->GetObjectLibrary()),
                        Forwarding::Yes);
      }
    }
    for (cmGeneratorTarget const* target : cli->GetExternalObjectTargets()) {
      addLinkedTarget(target, Forwarding::No);
    }
    if (lang == "Fortran"_s) {
      // Fortran modules provided by `$<TARGET_OBJECTS>` as sources should be
      // collated for use in this target.
      for (cmGeneratorTarget const* target :
           this->GeneratorTarget->GetSourceObjectLibraries(config)) {
        addLinkedTarget(target, Forwarding::Yes);
      }
    }
  }
  return dirs;
}